

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH128_hash_t
XXH3_hashLong_128b_default(void *input,size_t len,XXH64_hash_t seed64,void *secret,size_t secretLen)

{
  XXH3_f_scrambleAcc in_R9;
  XXH128_hash_t XVar1;
  
  XVar1 = XXH3_hashLong_128b_internal
                    (input,len,XXH3_kSecret,0xc0,(XXH3_f_accumulate_512)secretLen,in_R9);
  return XVar1;
}

Assistant:

XXH_NO_INLINE XXH128_hash_t XXH3_hashLong_128b_default(
    const void* XXH_RESTRICT input, size_t len, XXH64_hash_t seed64,
    const void* XXH_RESTRICT secret, size_t secretLen) {
  (void)seed64;
  (void)secret;
  (void)secretLen;
  return XXH3_hashLong_128b_internal(input, len, XXH3_kSecret,
                                     sizeof(XXH3_kSecret), XXH3_accumulate_512,
                                     XXH3_scrambleAcc);
}